

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

uint32_t F(mbedtls_blowfish_context *ctx,uint32_t x)

{
  uint32_t y;
  unsigned_short d;
  unsigned_short c;
  unsigned_short b;
  unsigned_short a;
  uint32_t x_local;
  mbedtls_blowfish_context *ctx_local;
  
  return (ctx->S[0][(byte)(x >> 0x18)] + ctx->S[1][(ushort)((x & 0xff00ff) >> 0x10)] ^
         ctx->S[2][(ushort)(x >> 8) & 0xff]) + ctx->S[3][(ushort)(x & 0xff00ff)];
}

Assistant:

static uint32_t F( mbedtls_blowfish_context *ctx, uint32_t x )
{
   unsigned short a, b, c, d;
   uint32_t  y;

   d = (unsigned short)(x & 0xFF);
   x >>= 8;
   c = (unsigned short)(x & 0xFF);
   x >>= 8;
   b = (unsigned short)(x & 0xFF);
   x >>= 8;
   a = (unsigned short)(x & 0xFF);
   y = ctx->S[0][a] + ctx->S[1][b];
   y = y ^ ctx->S[2][c];
   y = y + ctx->S[3][d];

   return( y );
}